

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvPostProcess.cpp
# Opt level: O0

void __thiscall spv::Builder::postProcessType(Builder *this,Instruction *inst,Id typeId)

{
  Capability CVar1;
  bool bVar2;
  Op OVar3;
  Op OVar4;
  Id resultId;
  StorageClass SVar5;
  uint uVar6;
  reference pCVar7;
  iterator iStack_58;
  Capability cap_1;
  _Self local_50;
  iterator it_1;
  bool foundStorage_1;
  iterator iStack_40;
  Capability cap;
  _Self local_38;
  iterator it;
  int iStack_24;
  bool foundStorage;
  StorageClass storageClass;
  int width;
  Id basicTypeOp;
  Id typeId_local;
  Instruction *inst_local;
  Builder *this_local;
  
  OVar3 = getMostBasicTypeClass(this,typeId);
  iStack_24 = 0;
  if ((OVar3 == OpTypeFloat) || (OVar3 == OpTypeInt)) {
    iStack_24 = getScalarTypeWidth(this,typeId);
  }
  OVar4 = spv::Instruction::getOpCode(inst);
  if (OVar4 == OpExtInst) {
    uVar6 = spv::Instruction::getImmediateOperand(inst,1);
    if (uVar6 - 0x33 < 2) {
      uVar6 = getSpvVersion(this);
      if ((uVar6 < 0x10300) && (bVar2 = containsType(this,typeId,OpTypeInt,0x10), bVar2)) {
        addExtension(this,"SPV_AMD_gpu_shader_int16");
      }
    }
    else if (((uVar6 - 0x4c < 3) && (uVar6 = getSpvVersion(this), uVar6 < 0x10300)) &&
            (bVar2 = containsType(this,typeId,OpTypeFloat,0x10), bVar2)) {
      addExtension(this,"SPV_AMD_gpu_shader_half_float");
    }
  }
  else if (OVar4 - OpLoad < 2) {
    if (OVar3 == OpTypeStruct) {
      bVar2 = containsType(this,typeId,OpTypeInt,8);
      if (bVar2) {
        addCapability(this,CapabilityInt8);
      }
      bVar2 = containsType(this,typeId,OpTypeInt,0x10);
      if (bVar2) {
        addCapability(this,CapabilityInt16);
      }
      bVar2 = containsType(this,typeId,OpTypeFloat,0x10);
      if (bVar2) {
        addCapability(this,CapabilityFloat16);
      }
    }
    else {
      resultId = spv::Instruction::getIdOperand(inst,0);
      SVar5 = getStorageClass(this,resultId);
      if (iStack_24 == 8) {
        if ((((SVar5 != StorageClassUniform) && (SVar5 != PushConstant)) && (SVar5 != StorageBuffer)
            ) && (SVar5 != PhysicalStorageBuffer)) {
          addCapability(this,CapabilityInt8);
        }
      }
      else if (((iStack_24 == 0x10) && (2 < SVar5 - Input)) &&
              ((SVar5 != PushConstant &&
               ((SVar5 != StorageBuffer && (SVar5 != PhysicalStorageBuffer)))))) {
        if (OVar3 == OpTypeInt) {
          addCapability(this,CapabilityInt16);
        }
        if (OVar3 == OpTypeFloat) {
          addCapability(this,CapabilityFloat16);
        }
      }
    }
  }
  else if ((OVar4 == OpAccessChain) || (OVar4 == OpPtrAccessChain)) {
    bVar2 = isPointerType(this,typeId);
    if ((!bVar2) && (OVar3 == OpTypeInt)) {
      if (iStack_24 == 0x10) {
        addCapability(this,CapabilityInt16);
      }
      else if (iStack_24 == 8) {
        addCapability(this,CapabilityInt8);
      }
    }
  }
  else if (OVar4 != OpCopyObject) {
    if (OVar4 - OpUConvert < 3) {
      bVar2 = containsType(this,typeId,OpTypeFloat,0x10);
      if ((bVar2) || (bVar2 = containsType(this,typeId,OpTypeInt,0x10), bVar2)) {
        it._M_node._7_1_ = 0;
        local_38._M_node =
             (_Base_ptr)
             std::set<spv::Capability,_std::less<spv::Capability>,_std::allocator<spv::Capability>_>
             ::begin(&this->capabilities);
        while( true ) {
          iStack_40 = std::
                      set<spv::Capability,_std::less<spv::Capability>,_std::allocator<spv::Capability>_>
                      ::end(&this->capabilities);
          bVar2 = std::operator!=(&local_38,&stack0xffffffffffffffc0);
          if (!bVar2) break;
          pCVar7 = std::_Rb_tree_const_iterator<spv::Capability>::operator*(&local_38);
          it_1._M_node._4_4_ = *pCVar7;
          if ((((it_1._M_node._4_4_ == CapabilityStorageInputOutput16) ||
               (it_1._M_node._4_4_ == CapabilityStoragePushConstant16)) ||
              (it_1._M_node._4_4_ == CapabilityStorageBuffer16BitAccess)) ||
             (it_1._M_node._4_4_ == CapabilityStorageUniform16)) {
            it._M_node._7_1_ = 1;
            break;
          }
          std::_Rb_tree_const_iterator<spv::Capability>::operator++(&local_38);
        }
        if ((it._M_node._7_1_ & 1) == 0) {
          bVar2 = containsType(this,typeId,OpTypeFloat,0x10);
          if (bVar2) {
            addCapability(this,CapabilityFloat16);
          }
          bVar2 = containsType(this,typeId,OpTypeInt,0x10);
          if (bVar2) {
            addCapability(this,CapabilityInt16);
          }
        }
      }
      bVar2 = containsType(this,typeId,OpTypeInt,8);
      if (bVar2) {
        it_1._M_node._3_1_ = 0;
        local_50._M_node =
             (_Base_ptr)
             std::set<spv::Capability,_std::less<spv::Capability>,_std::allocator<spv::Capability>_>
             ::begin(&this->capabilities);
        while( true ) {
          iStack_58 = std::
                      set<spv::Capability,_std::less<spv::Capability>,_std::allocator<spv::Capability>_>
                      ::end(&this->capabilities);
          bVar2 = std::operator!=(&local_50,&stack0xffffffffffffffa8);
          if (!bVar2) break;
          pCVar7 = std::_Rb_tree_const_iterator<spv::Capability>::operator*(&local_50);
          CVar1 = *pCVar7;
          if (((CVar1 == CapabilityStoragePushConstant8) ||
              (CVar1 == CapabilityUniformAndStorageBuffer8BitAccess)) ||
             (CVar1 == CapabilityStorageBuffer8BitAccess)) {
            it_1._M_node._3_1_ = 1;
            break;
          }
          std::_Rb_tree_const_iterator<spv::Capability>::operator++(&local_50);
        }
        if ((it_1._M_node._3_1_ & 1) == 0) {
          addCapability(this,CapabilityInt8);
        }
      }
    }
    else if (OVar3 == OpTypeInt) {
      if (iStack_24 == 0x10) {
        addCapability(this,CapabilityInt16);
      }
      else if (iStack_24 == 8) {
        addCapability(this,CapabilityInt8);
      }
      else if (iStack_24 == 0x40) {
        addCapability(this,CapabilityInt64);
      }
    }
    else if (OVar3 == OpTypeFloat) {
      if (iStack_24 == 0x10) {
        addCapability(this,CapabilityFloat16);
      }
      else if (iStack_24 == 0x40) {
        addCapability(this,CapabilityFloat64);
      }
    }
  }
  return;
}

Assistant:

void Builder::postProcessType(const Instruction& inst, Id typeId)
{
    // Characterize the type being questioned
    Id basicTypeOp = getMostBasicTypeClass(typeId);
    int width = 0;
    if (basicTypeOp == OpTypeFloat || basicTypeOp == OpTypeInt)
        width = getScalarTypeWidth(typeId);

    // Do opcode-specific checks
    switch (inst.getOpCode()) {
    case OpLoad:
    case OpStore:
        if (basicTypeOp == OpTypeStruct) {
            if (containsType(typeId, OpTypeInt, 8))
                addCapability(CapabilityInt8);
            if (containsType(typeId, OpTypeInt, 16))
                addCapability(CapabilityInt16);
            if (containsType(typeId, OpTypeFloat, 16))
                addCapability(CapabilityFloat16);
        } else {
            StorageClass storageClass = getStorageClass(inst.getIdOperand(0));
            if (width == 8) {
                switch (storageClass) {
                case StorageClassPhysicalStorageBufferEXT:
                case StorageClassUniform:
                case StorageClassStorageBuffer:
                case StorageClassPushConstant:
                    break;
                default:
                    addCapability(CapabilityInt8);
                    break;
                }
            } else if (width == 16) {
                switch (storageClass) {
                case StorageClassPhysicalStorageBufferEXT:
                case StorageClassUniform:
                case StorageClassStorageBuffer:
                case StorageClassPushConstant:
                case StorageClassInput:
                case StorageClassOutput:
                    break;
                default:
                    if (basicTypeOp == OpTypeInt)
                        addCapability(CapabilityInt16);
                    if (basicTypeOp == OpTypeFloat)
                        addCapability(CapabilityFloat16);
                    break;
                }
            }
        }
        break;
    case OpCopyObject:
        break;
    case OpFConvert:
    case OpSConvert:
    case OpUConvert:
        // Look for any 8/16-bit storage capabilities. If there are none, assume that
        // the convert instruction requires the Float16/Int8/16 capability.
        if (containsType(typeId, OpTypeFloat, 16) || containsType(typeId, OpTypeInt, 16)) {
            bool foundStorage = false;
            for (auto it = capabilities.begin(); it != capabilities.end(); ++it) {
                spv::Capability cap = *it;
                if (cap == spv::CapabilityStorageInputOutput16 ||
                    cap == spv::CapabilityStoragePushConstant16 ||
                    cap == spv::CapabilityStorageUniformBufferBlock16 ||
                    cap == spv::CapabilityStorageUniform16) {
                    foundStorage = true;
                    break;
                }
            }
            if (!foundStorage) {
                if (containsType(typeId, OpTypeFloat, 16))
                    addCapability(CapabilityFloat16);
                if (containsType(typeId, OpTypeInt, 16))
                    addCapability(CapabilityInt16);
            }
        }
        if (containsType(typeId, OpTypeInt, 8)) {
            bool foundStorage = false;
            for (auto it = capabilities.begin(); it != capabilities.end(); ++it) {
                spv::Capability cap = *it;
                if (cap == spv::CapabilityStoragePushConstant8 ||
                    cap == spv::CapabilityUniformAndStorageBuffer8BitAccess ||
                    cap == spv::CapabilityStorageBuffer8BitAccess) {
                    foundStorage = true;
                    break;
                }
            }
            if (!foundStorage) {
                addCapability(CapabilityInt8);
            }
        }
        break;
    case OpExtInst:
        switch (inst.getImmediateOperand(1)) {
        case GLSLstd450Frexp:
        case GLSLstd450FrexpStruct:
            if (getSpvVersion() < spv::Spv_1_3 && containsType(typeId, OpTypeInt, 16))
                addExtension(spv::E_SPV_AMD_gpu_shader_int16);
            break;
        case GLSLstd450InterpolateAtCentroid:
        case GLSLstd450InterpolateAtSample:
        case GLSLstd450InterpolateAtOffset:
            if (getSpvVersion() < spv::Spv_1_3 && containsType(typeId, OpTypeFloat, 16))
                addExtension(spv::E_SPV_AMD_gpu_shader_half_float);
            break;
        default:
            break;
        }
        break;
    case OpAccessChain:
    case OpPtrAccessChain:
        if (isPointerType(typeId))
            break;
        if (basicTypeOp == OpTypeInt) {
            if (width == 16)
                addCapability(CapabilityInt16);
            else if (width == 8)
                addCapability(CapabilityInt8);
        }
        break;
    default:
        if (basicTypeOp == OpTypeInt) {
            if (width == 16)
                addCapability(CapabilityInt16);
            else if (width == 8)
                addCapability(CapabilityInt8);
            else if (width == 64)
                addCapability(CapabilityInt64);
        } else if (basicTypeOp == OpTypeFloat) {
            if (width == 16)
                addCapability(CapabilityFloat16);
            else if (width == 64)
                addCapability(CapabilityFloat64);
        }
        break;
    }
}